

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.cc
# Opt level: O1

void __thiscall
bloaty::ReadDWARFPubNames(bloaty *this,InfoReader *reader,string_view section,RangeSink *sink)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  InfoReader *reader_00;
  bool bVar4;
  ulong uVar5;
  uint64_t offset;
  uint16_t *puVar6;
  InfoReader *filesize;
  string_view name;
  CompilationUnitSizes sizes;
  string_view unit;
  CU cu;
  CUIter iter;
  CompilationUnitSizes local_134;
  RangeSink *local_130;
  string_view local_128;
  string_view local_118;
  InfoReader *local_108;
  CU local_100;
  CUIter local_48;
  
  local_130 = (RangeSink *)section._M_str;
  local_118._M_str = (char *)section._M_len;
  if (reader != (InfoReader *)0x0) {
    local_118._M_len = (size_t)reader;
    local_108 = (InfoReader *)this;
    do {
      pcVar3 = local_118._M_str;
      sVar2 = local_118._M_len;
      local_128 = dwarf::CompilationUnitSizes::ReadInitialLength(&local_134,&local_118);
      puVar6 = (uint16_t *)local_128._M_str;
      uVar5 = local_128._M_len;
      filesize = (InfoReader *)((uVar5 - (long)pcVar3) + (long)puVar6);
      if (sVar2 < filesize) {
        filesize = (InfoReader *)sVar2;
      }
      if (uVar5 < 2) {
        Throw("premature EOF reading fixed-length data",0x8d);
      }
      local_134.dwarf_version_ = *puVar6;
      local_128._M_str = (char *)(puVar6 + 1);
      local_128._M_len = uVar5 - 2;
      offset = dwarf::CompilationUnitSizes::ReadDWARFOffset(&local_134,&local_128);
      reader_00 = local_108;
      dwarf::InfoReader::GetCUIter(&local_48,local_108,kDebugInfo,offset);
      local_100.data_._M_len = 0;
      local_100.data_._M_str = (char *)0x0;
      local_100.entire_unit_._M_len = 0;
      local_100.entire_unit_._M_str = (char *)0x0;
      local_100.unit_name_._M_dataplus._M_p = (pointer)&local_100.unit_name_.field_2;
      local_100.unit_name_._M_string_length = 0;
      local_100.unit_name_.field_2._M_local_buf[0] = '\0';
      local_100.strp_callback_._M_invoker = (_Invoker_type)0x0;
      local_100.strp_callback_.super__Function_base._M_functor._8_8_ = 0;
      local_100.strp_callback_.super__Function_base._M_manager = (_Manager_type)0x0;
      local_100.range_lists_base_ = 0;
      local_100.strp_callback_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
      local_100.addr_base_ = 0;
      local_100.str_offsets_base_ = 0;
      bVar4 = dwarf::CUIter::NextCU(&local_48,reader_00,&local_100);
      if ((bVar4) && (local_100.unit_name_._M_string_length != 0)) {
        pcVar1 = (local_130->file_->data_)._M_str;
        if ((pcVar1 <= pcVar3) && (pcVar3 < pcVar1 + (local_130->file_->data_)._M_len)) {
          name._M_str = local_100.unit_name_._M_dataplus._M_p;
          name._M_len = local_100.unit_name_._M_string_length;
          RangeSink::AddFileRange
                    (local_130,"dwarf_pubnames",name,(long)pcVar3 - (long)pcVar1,(uint64_t)filesize)
          ;
        }
      }
      if (local_100.strp_callback_.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_100.strp_callback_.super__Function_base._M_manager)
                  ((_Any_data *)&local_100.strp_callback_,(_Any_data *)&local_100.strp_callback_,
                   __destroy_functor);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100.unit_name_._M_dataplus._M_p != &local_100.unit_name_.field_2) {
        operator_delete(local_100.unit_name_._M_dataplus._M_p,
                        CONCAT71(local_100.unit_name_.field_2._M_allocated_capacity._1_7_,
                                 local_100.unit_name_.field_2._M_local_buf[0]) + 1);
      }
    } while ((InfoReader *)local_118._M_len != (InfoReader *)0x0);
  }
  return;
}

Assistant:

static void ReadDWARFPubNames(dwarf::InfoReader& reader, string_view section,
                              RangeSink* sink) {
  string_view remaining = section;

  while (remaining.size() > 0) {
    dwarf::CompilationUnitSizes sizes;
    string_view full_unit = remaining;
    string_view unit = sizes.ReadInitialLength(&remaining);
    full_unit =
        full_unit.substr(0, unit.size() + (unit.data() - full_unit.data()));
    sizes.ReadDWARFVersion(&unit);
    uint64_t debug_info_offset = sizes.ReadDWARFOffset(&unit);

    dwarf::CUIter iter = reader.GetCUIter(
        dwarf::InfoReader::Section::kDebugInfo, debug_info_offset);
    dwarf::CU cu;
    if (iter.NextCU(reader, &cu) && !cu.unit_name().empty()) {
      sink->AddFileRange("dwarf_pubnames", cu.unit_name(), full_unit);
    }
  }
}